

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_todayqps_by_region.cc
# Opt level: O3

int __thiscall
aliyun::Yundun::TodayqpsByRegion
          (Yundun *this,YundunTodayqpsByRegionResponseType *response,YundunErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  Int IVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  size_type *psVar12;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value VStack_318;
  value_type local_300;
  Value *local_2d0;
  vector<aliyun::YundunTodayqpsByRegionRegionType,_std::allocator<aliyun::YundunTodayqpsByRegionRegionType>_>
  *local_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_2c0 = local_2b0;
  local_2c8 = &response->data;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_300);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&VStack_318);
  piVar2 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_2c0,local_2b8 + (long)local_2c0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a0.field_2._M_allocated_capacity = *psVar12;
    local_2a0.field_2._8_8_ = plVar8[3];
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar12;
    local_2a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar2) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&VStack_318,nullValue);
  Json::Reader::Reader(&local_140);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Action","");
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"TodayqpsByRegion","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,this->region_id_,(allocator<char> *)&local_300);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_280);
    if (((0 < iVar4) && (local_280._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_280,&VStack_318,true), bVar3)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&VStack_318,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_318,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_300.region_id,pVVar10);
        }
        else {
          local_300.region_id._M_dataplus._M_p = (pointer)&local_300.region_id.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,anon_var_dwarf_f58ec + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_300);
        paVar1 = &local_300.region_id.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300.region_id._M_dataplus._M_p != paVar1) {
          operator_delete(local_300.region_id._M_dataplus._M_p,
                          CONCAT71(local_300.region_id.field_2._M_allocated_capacity._1_7_,
                                   local_300.region_id.field_2._M_local_buf[0]) + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_318,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_318,"Code");
          Json::Value::asString_abi_cxx11_(&local_300.region_id,pVVar10);
        }
        else {
          local_300.region_id._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,anon_var_dwarf_f58ec + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300.region_id._M_dataplus._M_p != paVar1) {
          operator_delete(local_300.region_id._M_dataplus._M_p,
                          CONCAT71(local_300.region_id.field_2._M_allocated_capacity._1_7_,
                                   local_300.region_id.field_2._M_local_buf[0]) + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_318,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_318,"HostId");
          Json::Value::asString_abi_cxx11_(&local_300.region_id,pVVar10);
        }
        else {
          local_300.region_id._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,anon_var_dwarf_f58ec + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300.region_id._M_dataplus._M_p != paVar1) {
          operator_delete(local_300.region_id._M_dataplus._M_p,
                          CONCAT71(local_300.region_id.field_2._M_allocated_capacity._1_7_,
                                   local_300.region_id.field_2._M_local_buf[0]) + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_318,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_318,"Message");
          Json::Value::asString_abi_cxx11_(&local_300.region_id,pVVar10);
        }
        else {
          local_300.region_id._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,anon_var_dwarf_f58ec + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_300);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300.region_id._M_dataplus._M_p != paVar1) {
          operator_delete(local_300.region_id._M_dataplus._M_p,
                          CONCAT71(local_300.region_id.field_2._M_allocated_capacity._1_7_,
                                   local_300.region_id.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_2c8 !=
          (vector<aliyun::YundunTodayqpsByRegionRegionType,_std::allocator<aliyun::YundunTodayqpsByRegionRegionType>_>
           *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&VStack_318,"Data");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_318,"Data");
          bVar3 = Json::Value::isMember(pVVar10,"Region");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&VStack_318,"Data");
            pVVar10 = Json::Value::operator[](pVVar10,"Region");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar10), AVar5 != 0)) {
              paVar1 = &local_300.region_id.field_2;
              index = 0;
              local_2d0 = pVVar10;
              do {
                local_300.region_id._M_string_length = 0;
                local_300.region_id.field_2._M_local_buf[0] = '\0';
                local_300.region_id._M_dataplus._M_p = (pointer)paVar1;
                pVVar10 = Json::Value::operator[](local_2d0,index);
                bVar3 = Json::Value::isMember(pVVar10,"RegionId");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"RegionId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_300,(string *)&local_160);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_160._M_dataplus._M_p != &local_160.field_2) {
                    operator_delete(local_160._M_dataplus._M_p,
                                    local_160.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"RegionNumber");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"RegionNumber");
                  IVar6 = Json::Value::asInt(pVVar11);
                  local_300.region_number = (long)IVar6;
                }
                bVar3 = Json::Value::isMember(pVVar10,"RegionFlow");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar10,"RegionFlow");
                  IVar6 = Json::Value::asInt(pVVar10);
                  local_300.region_flow = (long)IVar6;
                }
                std::
                vector<aliyun::YundunTodayqpsByRegionRegionType,_std::allocator<aliyun::YundunTodayqpsByRegionRegionType>_>
                ::push_back(local_2c8,&local_300);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_300.region_id._M_dataplus._M_p != paVar1) {
                  operator_delete(local_300.region_id._M_dataplus._M_p,
                                  CONCAT71(local_300.region_id.field_2._M_allocated_capacity._1_7_,
                                           local_300.region_id.field_2._M_local_buf[0]) + 1);
                }
                AVar5 = Json::Value::size(local_2d0);
                index = index + 1;
              } while (index < AVar5);
            }
          }
        }
      }
      goto LAB_00129d27;
    }
    if (error_info == (YundunErrorInfo *)0x0) goto LAB_00129d22;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (YundunErrorInfo *)0x0) {
LAB_00129d22:
      iVar4 = -1;
      goto LAB_00129d27;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_00129d27:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&VStack_318);
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0,local_2b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Yundun::TodayqpsByRegion(YundunTodayqpsByRegionResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","TodayqpsByRegion");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}